

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::JobManager::CreateJob
          (Error *__return_storage_ptr__,JobManager *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr,uint64_t aXpanId)

{
  Interpreter *aInterpreter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
  *this_00;
  bool bVar1;
  const_reference aStr;
  pointer ppVar2;
  Job *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  Job *local_180;
  Job *job;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  char *local_168;
  string local_160;
  _Self local_140 [3];
  string local_128;
  _Self local_108;
  const_iterator mapItem;
  JobEvaluator eval;
  uint64_t aXpanId_local;
  Expression *aExpr_local;
  CommissionerAppPtr *aCommissioner_local;
  JobManager *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b8 [3];
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  char *local_88;
  const_reference local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  
  std::
  function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function((function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&mapItem);
  this_00 = Interpreter::mJobEvaluatorMap_abi_cxx11_;
  aStr = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](aExpr,0);
  utils::ToLower(&local_128,aStr);
  local_108._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
       ::find(this_00,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  local_140[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
       ::end(Interpreter::mJobEvaluatorMap_abi_cxx11_);
  bVar1 = std::operator==(&local_108,local_140);
  if (bVar1) {
    CreateJob::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)((long)&job + 6));
    local_58 = &local_170;
    local_60 = (v10 *)((long)&job + 7);
    bVar3 = ::fmt::v10::operator()(local_60);
    local_168 = (char *)bVar3.size_;
    local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar3.data_;
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    local_80 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](aExpr,0);
    local_68 = &local_160;
    local_78 = local_170;
    pcStack_70 = local_168;
    local_50 = &local_78;
    local_90 = local_170;
    local_88 = local_168;
    local_48 = local_90;
    pcStack_40 = local_88;
    local_b8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                            ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_80,(v10 *)local_68,local_170);
    local_30 = local_a0;
    local_38 = local_b8;
    local_20 = 0xd;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0xd;
    fmt.data_ = local_88;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_160,(v10 *)local_90,fmt,args);
    Error::Error(__return_storage_ptr__,kInvalidCommand,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
             ::operator->(&local_108);
    std::
    function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::operator=((function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                 *)&mapItem,&ppVar2->second);
    this_01 = (Job *)operator_new(0xa0);
    aInterpreter = this->mInterpreter;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_198,aExpr);
    std::
    function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::function(&local_1b8,
               (function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&mapItem);
    Job::Job(this_01,aInterpreter,aCommissioner,&local_198,&local_1b8,aXpanId);
    std::
    function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::~function(&local_1b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_198);
    local_180 = this_01;
    std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::push_back
              (&this->mJobPool,&local_180);
    Error::Error(__return_storage_ptr__);
  }
  job._0_4_ = 1;
  std::
  function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function((function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
               *)&mapItem);
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::CreateJob(CommissionerAppPtr &aCommissioner, const Interpreter::Expression &aExpr, uint64_t aXpanId)
{
    Interpreter::JobEvaluator eval;
    auto                      mapItem = Interpreter::mJobEvaluatorMap.find(utils::ToLower(aExpr[0]));

    if (mapItem == Interpreter::mJobEvaluatorMap.end())
    {
        return ERROR_INVALID_COMMAND("{} not eligible for job", aExpr[0]);
    }
    eval     = mapItem->second;
    Job *job = new Job(mInterpreter, aCommissioner, aExpr, eval, aXpanId);
    mJobPool.push_back(job);

    return ERROR_NONE;
}